

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_markers.cpp
# Opt level: O1

string * get_path_from_template
                   (string *__return_storage_ptr__,string *template_string,string *file_name,
                   uint64_t time,uint64_t number)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char cVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  long *plVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  size_type *psVar10;
  char cVar11;
  string b;
  string c;
  string rep_str;
  string time_str;
  string number_str;
  string rep_name;
  long *local_160;
  long local_158;
  long local_150;
  long lStack_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 *local_120;
  undefined8 local_118;
  undefined1 local_110;
  undefined7 uStack_10f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  long *local_e0;
  uint local_d8;
  long local_d0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  long *local_98;
  long local_90;
  long local_88 [2];
  long *local_78;
  long local_70;
  long local_68 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  uint64_t local_38;
  
  local_c0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_c0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_78 = local_68;
  local_38 = number;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"$Number$","");
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"$Time$","");
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"$RepresentationID$","");
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  if ((file_name->_M_string_length != 0) &&
     (lVar4 = std::__cxx11::string::find_last_of((char *)file_name,0x11a091,0xffffffffffffffff),
     lVar4 != -1)) {
    std::__cxx11::string::substr((ulong)&local_140,(ulong)file_name);
    std::__cxx11::string::operator=((string *)&local_58,(string *)&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,
                      CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                               local_140.field_2._M_local_buf[0]) + 1);
    }
  }
  lVar4 = std::__cxx11::string::find_first_of((char *)template_string,(ulong)local_b8,0);
  if (lVar4 != -1) {
    paVar1 = &local_140.field_2;
    local_140._M_string_length = 0;
    local_140.field_2._M_local_buf[0] = '\0';
    local_118 = 0;
    local_110 = 0;
    local_140._M_dataplus._M_p = (pointer)paVar1;
    local_120 = &local_110;
    if (lVar4 != 0) {
      std::__cxx11::string::substr((ulong)&local_160,(ulong)template_string);
      std::__cxx11::string::operator=((string *)&local_140,(string *)&local_160);
      if (local_160 != &local_150) {
        operator_delete(local_160,local_150 + 1);
      }
    }
    if ((ulong)(local_b0 + lVar4) < template_string->_M_string_length) {
      std::__cxx11::string::substr((ulong)&local_160,(ulong)template_string);
      std::__cxx11::string::operator=((string *)&local_120,(string *)&local_160);
      if (local_160 != &local_150) {
        operator_delete(local_160,local_150 + 1);
      }
    }
    std::operator+(&local_100,&local_140,&local_58);
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_120);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_150 = *plVar7;
      lStack_148 = plVar5[3];
      local_160 = &local_150;
    }
    else {
      local_150 = *plVar7;
      local_160 = (long *)*plVar5;
    }
    local_158 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_160);
    if (local_160 != &local_150) {
      operator_delete(local_160,local_150 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,
                      CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                               local_140.field_2._M_local_buf[0]) + 1);
    }
  }
  lVar4 = std::__cxx11::string::find((char *)__return_storage_ptr__,(ulong)local_98,0);
  lVar6 = std::__cxx11::string::find((char *)__return_storage_ptr__,(ulong)local_78,0);
  uVar8 = local_38;
  if (lVar4 == -1) {
    if (lVar6 == -1) goto LAB_00105800;
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    local_140._M_string_length = 0;
    local_140.field_2._M_local_buf[0] = '\0';
    local_120 = &local_110;
    local_118 = 0;
    local_110 = 0;
    if (lVar6 != 0) {
      std::__cxx11::string::substr((ulong)&local_160,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)&local_140,(string *)&local_160);
      if (local_160 != &local_150) {
        operator_delete(local_160,local_150 + 1);
      }
    }
    if ((ulong)(local_70 + lVar6) < __return_storage_ptr__->_M_string_length) {
      std::__cxx11::string::substr((ulong)&local_160,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)&local_120,(string *)&local_160);
      if (local_160 != &local_150) {
        operator_delete(local_160,local_150 + 1);
      }
    }
    cVar11 = '\x01';
    if (9 < uVar8) {
      uVar9 = uVar8;
      cVar3 = '\x04';
      do {
        cVar11 = cVar3;
        if (uVar9 < 100) {
          cVar11 = cVar11 + -2;
          goto LAB_001058b0;
        }
        if (uVar9 < 1000) {
          cVar11 = cVar11 + -1;
          goto LAB_001058b0;
        }
        if (uVar9 < 10000) goto LAB_001058b0;
        bVar2 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        cVar3 = cVar11 + '\x04';
      } while (bVar2);
      cVar11 = cVar11 + '\x01';
    }
LAB_001058b0:
    local_e0 = local_d0;
    std::__cxx11::string::_M_construct((ulong)&local_e0,cVar11);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_e0,local_d8,uVar8);
    plVar5 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_e0,0,(char *)0x0,(ulong)local_140._M_dataplus._M_p);
    psVar10 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_100.field_2._M_allocated_capacity = *psVar10;
      local_100.field_2._8_8_ = plVar5[3];
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    }
    else {
      local_100.field_2._M_allocated_capacity = *psVar10;
      local_100._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_100._M_string_length = plVar5[1];
    *plVar5 = (long)psVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_120);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_150 = *plVar7;
      lStack_148 = plVar5[3];
      local_160 = &local_150;
    }
    else {
      local_150 = *plVar7;
      local_160 = (long *)*plVar5;
    }
    local_158 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_160);
    if (local_160 != &local_150) {
      operator_delete(local_160,local_150 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if (local_e0 != local_d0) {
      operator_delete(local_e0,local_d0[0] + 1);
    }
    if (local_120 != &local_110) goto LAB_001057dc;
  }
  else {
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    local_140._M_string_length = 0;
    local_140.field_2._M_local_buf[0] = '\0';
    local_118 = 0;
    local_110 = 0;
    local_120 = &local_110;
    if (lVar4 != 0) {
      std::__cxx11::string::substr((ulong)&local_160,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)&local_140,(string *)&local_160);
      if (local_160 != &local_150) {
        operator_delete(local_160,local_150 + 1);
      }
    }
    if ((ulong)(local_90 + lVar4) < __return_storage_ptr__->_M_string_length) {
      std::__cxx11::string::substr((ulong)&local_160,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)&local_120,(string *)&local_160);
      if (local_160 != &local_150) {
        operator_delete(local_160,local_150 + 1);
      }
    }
    cVar11 = '\x01';
    if (9 < time) {
      uVar8 = time;
      cVar3 = '\x04';
      do {
        cVar11 = cVar3;
        if (uVar8 < 100) {
          cVar11 = cVar11 + -2;
          goto LAB_00105686;
        }
        if (uVar8 < 1000) {
          cVar11 = cVar11 + -1;
          goto LAB_00105686;
        }
        if (uVar8 < 10000) goto LAB_00105686;
        bVar2 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        cVar3 = cVar11 + '\x04';
      } while (bVar2);
      cVar11 = cVar11 + '\x01';
    }
LAB_00105686:
    local_e0 = local_d0;
    std::__cxx11::string::_M_construct((ulong)&local_e0,cVar11);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_e0,local_d8,time);
    plVar5 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_e0,0,(char *)0x0,(ulong)local_140._M_dataplus._M_p);
    psVar10 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_100.field_2._M_allocated_capacity = *psVar10;
      local_100.field_2._8_8_ = plVar5[3];
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    }
    else {
      local_100.field_2._M_allocated_capacity = *psVar10;
      local_100._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_100._M_string_length = plVar5[1];
    *plVar5 = (long)psVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_120);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_150 = *plVar7;
      lStack_148 = plVar5[3];
      local_160 = &local_150;
    }
    else {
      local_150 = *plVar7;
      local_160 = (long *)*plVar5;
    }
    local_158 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_160);
    if (local_160 != &local_150) {
      operator_delete(local_160,local_150 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if (local_e0 != local_d0) {
      operator_delete(local_e0,local_d0[0] + 1);
    }
    if (local_120 != &local_110) {
LAB_001057dc:
      operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,
                    CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                             local_140.field_2._M_local_buf[0]) + 1);
  }
LAB_00105800:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_path_from_template(
    std::string& template_string,
    std::string& file_name,
    uint64_t time,
    uint64_t number)
{
    std::string out_string;

    const std::string number_str = "$Number$";
    const std::string time_str = "$Time$";
    const std::string rep_str = "$RepresentationID$";

    std::string rep_name;

    if (file_name.size() > 0)
    {
        size_t poss = file_name.find_last_of(".");
        if (poss != std::string::npos)
            rep_name = file_name.substr(0, poss);
    }

    size_t rep_pos = template_string.find_first_of(rep_str);

    if (rep_pos != std::string::npos)
    {
        std::string b, c;

        if (rep_pos != 0)
            b = template_string.substr(0, rep_pos);

        if (rep_pos + rep_str.size() < template_string.size())
            c = template_string.substr(rep_pos + rep_str.size());

        out_string = b + rep_name + c;
    }

    size_t time_pos = out_string.find(time_str);
    size_t num_pos = out_string.find(number_str);

    if (time_pos != std::string::npos)
    {
        std::string b, c;

        if (time_pos != 0)
            b = out_string.substr(0, time_pos);

        if (time_pos + time_str.size() < out_string.size())
            c = out_string.substr(time_pos + time_str.size());

        out_string = b + std::to_string(time) + c;
    }
    else if (num_pos != std::string::npos)
    {
        std::string b, c;

        if (num_pos != 0)
            b = out_string.substr(0, num_pos);

        if (num_pos + number_str.size() < out_string.size())
            c = out_string.substr(num_pos + number_str.size());

        out_string = b + std::to_string(number) + c;
    }

    return out_string;
}